

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractMajor.hpp
# Opt level: O2

void __thiscall AbstractMajor::getRequirements(AbstractMajor *this)

{
  char cVar1;
  istream *piVar2;
  invalid_argument *this_00;
  string temp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  ifstream fin;
  
  std::operator+(&local_248,"major/",&this->name);
  std::operator+(&temp,&local_248,".txt");
  std::ifstream::ifstream(&fin,(string *)&temp,_S_in);
  std::__cxx11::string::~string((string *)&temp);
  std::__cxx11::string::~string((string *)&local_248);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    temp._M_dataplus._M_p = (pointer)&temp.field_2;
    temp._M_string_length = 0;
    temp.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&fin,(string *)&temp);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->requiredCourses,&temp);
    }
    std::__cxx11::string::~string((string *)&temp);
    std::ifstream::~ifstream(&fin);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_248,"Error, requirements file for ",&this->name);
  std::operator+(&temp,&local_248," not found.");
  std::invalid_argument::invalid_argument(this_00,(string *)&temp);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void getRequirements() {
            ifstream fin("major/" + this->name + ".txt");
            
            if (!fin.is_open()) {
                throw std::invalid_argument("Error, requirements file for " + this->name + " not found.");
            }
            string temp;

            while(getline(fin, temp)) {
                requiredCourses.push_back(temp);
            }
        }